

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_tests.cc
# Opt level: O0

void __thiscall
lf::fe::test::lf_fe_MassElementMatrixProviderComplex_Test::
~lf_fe_MassElementMatrixProviderComplex_Test(lf_fe_MassElementMatrixProviderComplex_Test *this)

{
  lf_fe_MassElementMatrixProviderComplex_Test *this_local;
  
  ~lf_fe_MassElementMatrixProviderComplex_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_fe, MassElementMatrixProviderComplex) {
  auto mesh = mesh::test_utils::GenerateHybrid2DTestMesh(5);

  auto g = mesh::utils::MeshFunctionConstant(std::complex<double>{1, 2});

  auto fes = fe::test_utils::MakeComplexLagrangeO1FeSpace(mesh);
  MassElementMatrixProvider emp(fes, g);
  auto evaluator = [&](const Eigen::VectorXcd &test_coeff,
                       Eigen::VectorXcd &trial_coeff) {
    auto mf_test = MeshFunctionFE(fes, test_coeff);
    auto mf_trial = MeshFunctionFE(fes, trial_coeff);
    return IntegrateMeshFunction(*mesh, conjugate(mf_test) * mf_trial * g, 2);
  };
  CheckElementMatrixProvider(*fes, *fes, emp, evaluator);
}